

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

View<int,_false,_std::allocator<unsigned_long>_> * __thiscall
andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
          (View<int,_false,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          View<int,_false,_std::allocator<unsigned_long>_> *this,size_t dimension,size_t value)

{
  size_t *psVar1;
  bool bVar2;
  size_t sVar3;
  reference piVar4;
  size_t *psVar5;
  runtime_error *prVar6;
  ulong uVar7;
  pointer piVar8;
  size_t sVar9;
  long lVar10;
  ulong dimension_00;
  
  testInvariant(this);
  if (this->data_ == (pointer)0x0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Assertion failed.");
  }
  else if ((dimension < (this->geometry_).dimension_) &&
          (sVar3 = shape(this,dimension), value < sVar3)) {
    if (this->data_ != (pointer)0x0) {
      if ((this->geometry_).dimension_ == 1) {
        piVar4 = operator()(this,value);
        __return_storage_ptr__->data_ = piVar4;
        psVar5 = (size_t *)operator_new(0);
        (__return_storage_ptr__->geometry_).shape_ = psVar5;
        (__return_storage_ptr__->geometry_).shapeStrides_ = psVar5;
        (__return_storage_ptr__->geometry_).strides_ = psVar5;
        (__return_storage_ptr__->geometry_).dimension_ = 0;
        (__return_storage_ptr__->geometry_).size_ = 1;
        (__return_storage_ptr__->geometry_).coordinateOrder_ = LastMajorOrder;
        (__return_storage_ptr__->geometry_).isSimple_ = true;
        testInvariant(__return_storage_ptr__);
        testInvariant(this);
        (__return_storage_ptr__->geometry_).coordinateOrder_ = (this->geometry_).coordinateOrder_;
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->data_ = (pointer)0x0;
      (__return_storage_ptr__->geometry_).shape_ = (size_t *)0x0;
      (__return_storage_ptr__->geometry_).shapeStrides_ = (size_t *)0x0;
      (__return_storage_ptr__->geometry_).strides_ = (size_t *)0x0;
      (__return_storage_ptr__->geometry_).dimension_ = 0;
      (__return_storage_ptr__->geometry_).size_ = 0;
      (__return_storage_ptr__->geometry_).coordinateOrder_ = LastMajorOrder;
      (__return_storage_ptr__->geometry_).isSimple_ = true;
      testInvariant(__return_storage_ptr__);
      if (this->data_ == (pointer)0x0) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"Assertion failed.");
LAB_0022f54a:
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      marray_detail::Geometry<std::allocator<unsigned_long>_>::resize
                (&__return_storage_ptr__->geometry_,(this->geometry_).dimension_ - 1);
      testInvariant(this);
      (__return_storage_ptr__->geometry_).coordinateOrder_ = (this->geometry_).coordinateOrder_;
      uVar7 = (this->geometry_).size_;
      sVar3 = shape(this,dimension);
      (__return_storage_ptr__->geometry_).size_ = uVar7 / sVar3;
      piVar8 = this->data_;
      if (piVar8 == (pointer)0x0) {
LAB_0022f34e:
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"Assertion failed.");
LAB_0022f48c:
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar7 = 0;
      dimension_00 = 0;
      while (dimension_00 < (this->geometry_).dimension_) {
        if (dimension != dimension_00) {
          sVar3 = shape(this,dimension_00);
          if ((__return_storage_ptr__->geometry_).dimension_ <= uVar7) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"Assertion failed.");
            goto LAB_0022f48c;
          }
          (__return_storage_ptr__->geometry_).shape_[uVar7] = sVar3;
          sVar3 = strides(this,dimension_00);
          if ((__return_storage_ptr__->geometry_).dimension_ <= uVar7) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"Assertion failed.");
            goto LAB_0022f48c;
          }
          (__return_storage_ptr__->geometry_).strides_[uVar7] = sVar3;
          uVar7 = uVar7 + 1;
          piVar8 = this->data_;
        }
        dimension_00 = dimension_00 + 1;
        if (piVar8 == (pointer)0x0) goto LAB_0022f34e;
      }
      sVar3 = (__return_storage_ptr__->geometry_).dimension_;
      if (sVar3 == 0) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"Assertion failed.");
        goto LAB_0022f54a;
      }
      psVar5 = (__return_storage_ptr__->geometry_).shape_;
      psVar1 = (__return_storage_ptr__->geometry_).shapeStrides_;
      if ((__return_storage_ptr__->geometry_).coordinateOrder_ == FirstMajorOrder) {
        psVar1[sVar3 - 1] = 1;
        if (sVar3 != 1) {
          sVar9 = 1;
          do {
            sVar9 = sVar9 * psVar5[sVar3 - 1];
            psVar1[sVar3 - 2] = sVar9;
            sVar3 = sVar3 - 1;
          } while (sVar3 != 1);
        }
      }
      else {
        *psVar1 = 1;
        if (sVar3 != 1) {
          sVar9 = 1;
          lVar10 = 0;
          do {
            sVar9 = sVar9 * psVar5[lVar10];
            psVar1[lVar10 + 1] = sVar9;
            lVar10 = lVar10 + 1;
          } while (sVar3 - 1 != lVar10);
        }
      }
      sVar3 = strides(this,dimension);
      __return_storage_ptr__->data_ = piVar8 + sVar3 * value;
      sVar3 = (__return_storage_ptr__->geometry_).dimension_;
      bVar2 = true;
      if (sVar3 != 0) {
        sVar9 = 0;
        do {
          if ((__return_storage_ptr__->geometry_).shapeStrides_[sVar9] !=
              (__return_storage_ptr__->geometry_).strides_[sVar9]) {
            bVar2 = false;
            break;
          }
          sVar9 = sVar9 + 1;
        } while (sVar3 != sVar9);
      }
      (__return_storage_ptr__->geometry_).isSimple_ = bVar2;
      testInvariant(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Assertion failed.");
  }
  else {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Assertion failed.");
  }
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

View<T, isConst, A>
View<T, isConst, A>::boundView
(
    const std::size_t dimension,
    const std::size_t value
) const
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_ARG_TEST || (dimension < this->dimension()
        && value < shape(dimension)));
    if(this->dimension() == 1) {
        View v(&((*this)(value)));
        v.geometry_.coordinateOrder() = coordinateOrder();
        return v;
    }
    else {
        View v;
        v.geometry_.resize(this->dimension()-1);
        v.geometry_.coordinateOrder() = coordinateOrder();
        v.geometry_.size() = size() / shape(dimension);
        for(std::size_t j=0, k=0; j<this->dimension(); ++j) {
            if(j != dimension) {
                v.geometry_.shape(k) = shape(j);
                v.geometry_.strides(k) = strides(j);
                ++k;
            }
        }
        marray_detail::stridesFromShape(v.geometry_.shapeBegin(), v.geometry_.shapeEnd(),
            v.geometry_.shapeStridesBegin(), v.geometry_.coordinateOrder());
        v.data_ = data_ + strides(dimension) * value;
        v.updateSimplicity();
        v.testInvariant();
        return v;
    }
}